

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O3

string * efsw::Platform::findDevicePath(string *__return_storage_ptr__,string *directory)

{
  string *psVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  string dirName;
  allocator local_59;
  string *local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  lVar4 = setmntent("/proc/mounts","r");
  if (lVar4 != 0) {
    local_58 = __return_storage_ptr__;
    puVar5 = (undefined8 *)getmntent(lVar4);
    if (puVar5 != (undefined8 *)0x0) {
      do {
        std::__cxx11::string::string((string *)&local_50,(char *)puVar5[1],&local_59);
        puVar2 = local_50;
        if ((local_48 == directory->_M_string_length) &&
           ((local_48 == 0 ||
            (iVar3 = bcmp(local_50,(directory->_M_dataplus)._M_p,local_48), iVar3 == 0)))) {
          psVar1 = local_58;
          std::__cxx11::string::string((string *)local_58,(char *)*puVar5,&local_59);
          endmntent(lVar4);
          if (local_50 == local_40) {
            return psVar1;
          }
          operator_delete(local_50);
          return psVar1;
        }
        if (puVar2 != local_40) {
          operator_delete(puVar2);
        }
        puVar5 = (undefined8 *)getmntent(lVar4);
      } while (puVar5 != (undefined8 *)0x0);
    }
    endmntent(lVar4);
    __return_storage_ptr__ = local_58;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string findDevicePath( const std::string& directory ) {
	struct mntent* ent;
	FILE* aFile;

	aFile = setmntent( "/proc/mounts", "r" );

	if ( aFile == NULL )
		return "";

	while ( NULL != ( ent = getmntent( aFile ) ) ) {
		std::string dirName( ent->mnt_dir );

		if ( dirName == directory ) {
			std::string fsName( ent->mnt_fsname );

			endmntent( aFile );

			return fsName;
		}
	}

	endmntent( aFile );

	return "";
}